

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::Snapshot::ComputeRelativePathTopBinary(Snapshot *this)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  pointer this_01;
  ulong uVar3;
  PointerType pSVar4;
  PointerType pBVar5;
  bool local_13a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator local_d1;
  undefined1 local_d0 [8];
  string currentBinary;
  __normal_iterator<cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
  local_a8;
  __normal_iterator<cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
  local_a0;
  __normal_iterator<const_cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
  local_98;
  const_iterator it;
  undefined1 local_88 [8];
  string result;
  undefined1 local_40 [8];
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> snapshots;
  Snapshot snapshot;
  Snapshot *this_local;
  
  snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this->State;
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::vector
            ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40);
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
            ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40,
             (value_type *)
             &snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    GetBuildsystemDirectoryParent
              ((Snapshot *)((long)&result.field_2 + 8),
               (Snapshot *)
               &snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)result.field_2._8_8_;
    bVar1 = IsValid((Snapshot *)
                    &snapshots.
                     super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
              ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40,
               (value_type *)
               &snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  this_00 = std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::front
                      ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40);
  pcVar2 = GetCurrentBinaryDirectory(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_88,pcVar2,(allocator *)((long)&it._M_current + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  local_a8._M_current =
       (Snapshot *)
       std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::begin
                 ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40);
  local_a0 = __gnu_cxx::
             __normal_iterator<cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
             ::operator+(&local_a8,1);
  __gnu_cxx::
  __normal_iterator<cmState::Snapshot_const*,std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>>
  ::__normal_iterator<cmState::Snapshot*>
            ((__normal_iterator<cmState::Snapshot_const*,std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>>
              *)&local_98,&local_a0);
  while( true ) {
    currentBinary.field_2._8_8_ =
         std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::end
                   ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40);
    bVar1 = __gnu_cxx::operator!=
                      (&local_98,
                       (__normal_iterator<cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
                        *)((long)&currentBinary.field_2 + 8));
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
              ::operator->(&local_98);
    pcVar2 = GetCurrentBinaryDirectory(this_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_d0,pcVar2,&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_88,(string *)local_d0);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_88,(string *)local_d0);
    }
    std::__cxx11::string::~string((string *)local_d0);
    __gnu_cxx::
    __normal_iterator<const_cmState::Snapshot_*,_std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>_>
    ::operator++(&local_98);
  }
  uVar3 = std::__cxx11::string::size();
  local_13a = true;
  if (1 < uVar3) {
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)local_88);
    local_13a = std::operator!=(&local_f8,"//");
    std::__cxx11::string::~string((string *)&local_f8);
  }
  if (local_13a == false) {
    pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
    pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar4->BuildSystemDirectory);
    std::__cxx11::string::operator=((string *)&pBVar5->RelativePathTopBinary,"");
  }
  else {
    pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
    pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar4->BuildSystemDirectory);
    std::__cxx11::string::operator=((string *)&pBVar5->RelativePathTopBinary,(string *)local_88);
  }
  std::__cxx11::string::~string((string *)local_88);
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::~vector
            ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)local_40);
  return;
}

Assistant:

void cmState::Snapshot::ComputeRelativePathTopBinary()
{
  cmState::Snapshot snapshot = *this;
  std::vector<cmState::Snapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true)
    {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid())
      {
      snapshots.push_back(snapshot);
      }
    else
      {
      break;
      }
    }

  std::string result =
      snapshots.front().GetCurrentBinaryDirectory();

  for (std::vector<cmState::Snapshot>::const_iterator it =
       snapshots.begin() + 1; it != snapshots.end(); ++it)
    {
    std::string currentBinary = it->GetCurrentBinaryDirectory();
    if(cmSystemTools::IsSubDirectory(result, currentBinary))
      {
      result = currentBinary;
      }
    }

  // The current working directory on Windows cannot be a network
  // path.  Therefore relative paths cannot work when the binary tree
  // is a network path.
  if(result.size() < 2 || result.substr(0, 2) != "//")
    {
    this->Position->BuildSystemDirectory->RelativePathTopBinary = result;
    }
  else
    {
    this->Position->BuildSystemDirectory->RelativePathTopBinary = "";
    }
}